

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertion_result.hpp
# Opt level: O0

const_string __thiscall boost::test_tools::assertion_result::message(assertion_result *this)

{
  bool bVar1;
  iterator extraout_RDX;
  iterator extraout_RDX_00;
  iterator pvVar2;
  std_string *in_RSI;
  basic_cstring<const_char> *in_RDI;
  const_string cVar3;
  basic_wrap_stringstream<char> *unaff_retaddr;
  std_string *this_00;
  
  this_00 = in_RSI;
  bVar1 = shared_ptr<boost::basic_wrap_stringstream<char>_>::operator!
                    ((shared_ptr<boost::basic_wrap_stringstream<char>_> *)&in_RSI->_M_string_length)
  ;
  if (bVar1) {
    unit_test::basic_cstring<const_char>::basic_cstring(in_RDI);
    pvVar2 = extraout_RDX;
  }
  else {
    shared_ptr<boost::basic_wrap_stringstream<char>_>::operator->
              ((shared_ptr<boost::basic_wrap_stringstream<char>_> *)in_RDI);
    basic_wrap_stringstream<char>::str_abi_cxx11_(unaff_retaddr);
    unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00,in_RSI)
    ;
    pvVar2 = extraout_RDX_00;
  }
  cVar3.m_end = pvVar2;
  cVar3.m_begin = (iterator)in_RDI;
  return cVar3;
}

Assistant:

const_string        message() const                   { return !m_message ? const_string() : const_string( m_message->str() ); }